

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32_ssse3.c
# Opt level: O1

uint32_t adler32_ssse3(uint32_t adler,uint8_t *buf,size_t len)

{
  undefined1 (*pauVar1) [16];
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t i;
  long lVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  undefined1 auVar27 [16];
  int iVar28;
  int iVar29;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  undefined1 auVar30 [16];
  int iVar36;
  undefined1 auVar37 [16];
  
  uVar8 = (ulong)adler & 0xffff;
  uVar11 = adler >> 0x10;
  uVar5 = (ulong)uVar11;
  if (len == 1) {
    uVar6 = ((int)uVar8 + (uint)*buf) % 0xfff1;
    uVar5 = (ulong)(uVar11 + uVar6);
  }
  else {
    if (buf == (uint8_t *)0x0) {
      return 1;
    }
    if (0xf < len) {
      uVar2 = 0x15b0;
      uVar7 = (ulong)((uint)buf & 0xf);
      if (((ulong)buf & 0xf) == 0) goto LAB_00103861;
      if (0x20 - uVar7 <= len) {
        lVar3 = 0x10 - uVar7;
        lVar9 = 0;
        do {
          uVar11 = (int)uVar8 + (uint)buf[lVar9];
          uVar8 = (ulong)uVar11;
          uVar5 = (ulong)((int)uVar5 + uVar11);
          lVar9 = lVar9 + 1;
        } while (lVar3 != lVar9);
        buf = buf + lVar3;
        len = len - lVar3;
        uVar2 = uVar7 | 0x15a0;
        goto LAB_00103861;
      }
      len = len - 0x10;
      iVar13 = 0;
      iVar15 = 0;
      iVar17 = 0;
      iVar18 = 0;
      iVar19 = 0;
      iVar20 = 0;
      iVar21 = 0;
      uVar2 = 0;
      iVar26 = (int)uVar8;
      iVar10 = 0;
      iVar12 = 0;
      iVar14 = 0;
      do {
        auVar27 = *(undefined1 (*) [16])buf;
        buf = (uint8_t *)((long)buf + 0x10);
        auVar30 = psadbw((undefined1  [16])0x0,auVar27);
        iVar29 = auVar30._0_4_ + iVar26;
        iVar32 = auVar30._4_4_ + iVar10;
        iVar34 = auVar30._8_4_ + iVar12;
        iVar36 = auVar30._12_4_ + iVar14;
        iVar18 = iVar18 + iVar26;
        iVar19 = iVar19 + iVar10;
        iVar20 = iVar20 + iVar12;
        iVar21 = iVar21 + iVar14;
        auVar27 = pmaddubsw(auVar27,_DAT_0011cce0);
        auVar27 = pmaddwd(auVar27,_DAT_0011ccd0);
        uVar11 = uVar11 + auVar27._0_4_;
        iVar13 = iVar13 + auVar27._4_4_;
        iVar15 = iVar15 + auVar27._8_4_;
        iVar17 = iVar17 + auVar27._12_4_;
        while (uVar2 < 0x10) {
          auVar27._0_4_ = uVar11 + iVar18 * 0x10;
          auVar27._4_4_ = iVar13 + iVar19 * 0x10;
          auVar27._8_4_ = iVar15 + iVar20 * 0x10;
          auVar27._12_4_ = iVar17 + iVar21 * 0x10;
          auVar27 = phaddd(auVar27,auVar27);
          uVar8 = (ulong)(uint)(iVar34 + iVar29) % 0xfff1;
          auVar27 = phaddd(auVar27,auVar27);
          uVar5 = (ulong)auVar27._0_4_ % 0xfff1;
          uVar2 = 0x15b0;
LAB_00103861:
          if (len < 0x10) {
            if (len != 0) {
              uVar2 = 0;
              do {
                uVar11 = (int)uVar8 + (uint)(byte)(*(undefined1 (*) [16])buf)[uVar2];
                uVar8 = (ulong)uVar11;
                uVar5 = (ulong)((int)uVar5 + uVar11);
                uVar2 = uVar2 + 1;
              } while (len != uVar2);
            }
            goto LAB_00103949;
          }
          iVar29 = (int)uVar8;
          iVar32 = 0;
          iVar34 = 0;
          iVar36 = 0;
          iVar26 = (int)uVar5;
          iVar13 = 0;
          iVar15 = 0;
          iVar17 = 0;
          if (len < uVar2) {
            uVar2 = len;
          }
          uVar2 = uVar2 & 0xfffffffffffffff0;
          uVar8 = len - uVar2;
          iVar18 = 0;
          iVar19 = 0;
          iVar20 = 0;
          iVar21 = 0;
          if (len < 0x20) {
            iVar10 = 0;
            iVar12 = 0;
            iVar14 = 0;
            iVar16 = 0;
            iVar28 = 0;
            iVar31 = 0;
            iVar33 = 0;
            iVar35 = 0;
          }
          else {
            iVar28 = 0;
            iVar31 = 0;
            iVar33 = 0;
            iVar35 = 0;
            iVar10 = 0;
            iVar12 = 0;
            iVar14 = 0;
            iVar16 = 0;
            iVar22 = iVar29;
            iVar23 = iVar32;
            iVar24 = iVar34;
            iVar25 = iVar36;
            do {
              auVar27 = *(undefined1 (*) [16])buf;
              pauVar1 = (undefined1 (*) [16])((long)buf + 0x10);
              buf = (uint8_t *)((long)buf + 0x20);
              uVar2 = uVar2 - 0x20;
              auVar30 = psadbw(auVar27,(undefined1  [16])0x0);
              auVar37 = psadbw(*pauVar1,(undefined1  [16])0x0);
              iVar29 = auVar30._0_4_ + iVar22 + auVar37._0_4_;
              iVar32 = auVar30._4_4_ + iVar23 + auVar37._4_4_;
              iVar34 = auVar30._8_4_ + iVar24 + auVar37._8_4_;
              iVar36 = auVar30._12_4_ + iVar25 + auVar37._12_4_;
              iVar10 = iVar10 + iVar22;
              iVar12 = iVar12 + iVar23;
              iVar14 = iVar14 + iVar24;
              iVar16 = iVar16 + iVar25;
              auVar27 = pmaddubsw(auVar27,_DAT_0011ccc0);
              auVar27 = pmaddwd(auVar27,_DAT_0011ccd0);
              iVar26 = iVar26 + auVar27._0_4_;
              iVar13 = iVar13 + auVar27._4_4_;
              iVar15 = iVar15 + auVar27._8_4_;
              iVar17 = iVar17 + auVar27._12_4_;
              auVar27 = pmaddubsw(*pauVar1,_DAT_0011cce0);
              auVar27 = pmaddwd(auVar27,_DAT_0011ccd0);
              iVar28 = iVar28 + auVar27._0_4_;
              iVar31 = iVar31 + auVar27._4_4_;
              iVar33 = iVar33 + auVar27._8_4_;
              iVar35 = iVar35 + auVar27._12_4_;
              iVar22 = iVar29;
              iVar23 = iVar32;
              iVar24 = iVar34;
              iVar25 = iVar36;
            } while (0x1f < uVar2);
            iVar10 = iVar10 * 0x20;
            iVar12 = iVar12 * 0x20;
            iVar14 = iVar14 * 0x20;
            iVar16 = iVar16 * 0x20;
          }
          uVar11 = iVar10 + iVar28 + iVar26;
          iVar13 = iVar12 + iVar31 + iVar13;
          iVar15 = iVar14 + iVar33 + iVar15;
          iVar17 = iVar16 + iVar35 + iVar17;
          len = uVar8;
        }
        uVar2 = uVar2 - 0x10;
        iVar26 = iVar29;
        iVar10 = iVar32;
        iVar12 = iVar34;
        iVar14 = iVar36;
      } while( true );
    }
    if (len != 0) {
      sVar4 = 0;
      do {
        uVar11 = (int)uVar8 + (uint)buf[sVar4];
        uVar8 = (ulong)uVar11;
        uVar5 = (ulong)((int)uVar5 + uVar11);
        sVar4 = sVar4 + 1;
      } while (len != sVar4);
    }
LAB_00103949:
    uVar6 = (uint)(uVar8 % 0xfff1);
  }
  return (int)(uVar5 % 0xfff1) << 0x10 | uVar6;
}

Assistant:

Z_INTERNAL uint32_t adler32_ssse3(uint32_t adler, const uint8_t *buf, size_t len) {
    uint32_t sum2;

     /* split Adler-32 into component sums */
    sum2 = (adler >> 16) & 0xffff;
    adler &= 0xffff;

    /* in case user likes doing a byte at a time, keep it fast */
    if (UNLIKELY(len == 1))
        return adler32_len_1(adler, buf, sum2);

    /* initial Adler-32 value (deferred check for len == 1 speed) */
    if (UNLIKELY(buf == NULL))
        return 1L;

    /* in case short lengths are provided, keep it somewhat fast */
    if (UNLIKELY(len < 16))
        return adler32_len_16(adler, buf, len, sum2);

    const __m128i dot2v = _mm_setr_epi8(32, 31, 30, 29, 28, 27, 26, 25, 24, 23, 22, 21, 20, 19, 18, 17);
    const __m128i dot2v_0 = _mm_setr_epi8(16, 15, 14, 13, 12, 11, 10, 9, 8, 7, 6, 5, 4, 3, 2, 1);
    const __m128i dot3v = _mm_set1_epi16(1);
    const __m128i zero = _mm_setzero_si128();

    __m128i vbuf, vs1_0, vs3, vs1, vs2, vs2_0, v_sad_sum1, v_short_sum2, v_short_sum2_0,
            vbuf_0, v_sad_sum2, vsum2, vsum2_0;

    /* If our buffer is unaligned (likely), make the determination whether
     * or not there's enough of a buffer to consume to make the scalar, aligning
     * additions worthwhile or if it's worth it to just eat the cost of an unaligned
     * load. This is a pretty simple test, just test if 16 - the remainder + len is
     * < 16 */
    size_t max_iters = NMAX;
    size_t rem = (uintptr_t)buf & 15;
    size_t align_offset = 16 - rem;
    size_t k = 0;
    if (rem) {
        if (len < 16 + align_offset) {
            /* Let's eat the cost of this one unaligned load so that
             * we don't completely skip over the vectorization. Doing
             * 16 bytes at a time unaligned is better than 16 + <= 15
             * sums */
            vbuf = _mm_loadu_si128((__m128i*)buf);
            len -= 16;
            buf += 16;
            vs1 = _mm_cvtsi32_si128(adler);
            vs2 = _mm_cvtsi32_si128(sum2);
            vs3 = _mm_setzero_si128();
            vs1_0 = vs1;
            goto unaligned_jmp;
        }

        for (size_t i = 0; i < align_offset; ++i) {
            adler += *(buf++);
            sum2 += adler;
        }

        /* lop off the max number of sums based on the scalar sums done
         * above */
        len -= align_offset;
        max_iters -= align_offset;
    }


    while (len >= 16) {
        vs1 = _mm_cvtsi32_si128(adler);
        vs2 = _mm_cvtsi32_si128(sum2);
        vs3 = _mm_setzero_si128();
        vs2_0 = _mm_setzero_si128();
        vs1_0 = vs1;

        k = (len < max_iters ? len : max_iters);
        k -= k % 16;
        len -= k;

        while (k >= 32) {
            /*
               vs1 = adler + sum(c[i])
               vs2 = sum2 + 16 vs1 + sum( (16-i+1) c[i] )
            */
            vbuf = _mm_load_si128((__m128i*)buf);
            vbuf_0 = _mm_load_si128((__m128i*)(buf + 16));
            buf += 32;
            k -= 32;

            v_sad_sum1 = _mm_sad_epu8(vbuf, zero);
            v_sad_sum2 = _mm_sad_epu8(vbuf_0, zero);
            vs1 = _mm_add_epi32(v_sad_sum1, vs1);
            vs3 = _mm_add_epi32(vs1_0, vs3);

            vs1 = _mm_add_epi32(v_sad_sum2, vs1);
            v_short_sum2 = _mm_maddubs_epi16(vbuf, dot2v);
            vsum2 = _mm_madd_epi16(v_short_sum2, dot3v);
            v_short_sum2_0 = _mm_maddubs_epi16(vbuf_0, dot2v_0);
            vs2 = _mm_add_epi32(vsum2, vs2);
            vsum2_0 = _mm_madd_epi16(v_short_sum2_0, dot3v);
            vs2_0 = _mm_add_epi32(vsum2_0, vs2_0);
            vs1_0 = vs1;
        }

        vs2 = _mm_add_epi32(vs2_0, vs2);
        vs3 = _mm_slli_epi32(vs3, 5);
        vs2 = _mm_add_epi32(vs3, vs2);
        vs3 = _mm_setzero_si128();

        while (k >= 16) {
            /*
               vs1 = adler + sum(c[i])
               vs2 = sum2 + 16 vs1 + sum( (16-i+1) c[i] )
            */
            vbuf = _mm_load_si128((__m128i*)buf);
            buf += 16;
            k -= 16;

unaligned_jmp:
            v_sad_sum1 = _mm_sad_epu8(vbuf, zero);
            vs1 = _mm_add_epi32(v_sad_sum1, vs1);
            vs3 = _mm_add_epi32(vs1_0, vs3);
            v_short_sum2 = _mm_maddubs_epi16(vbuf, dot2v_0);
            vsum2 = _mm_madd_epi16(v_short_sum2, dot3v);
            vs2 = _mm_add_epi32(vsum2, vs2);
            vs1_0 = vs1;
        }

        vs3 = _mm_slli_epi32(vs3, 4);
        vs2 = _mm_add_epi32(vs2, vs3);

        /* We don't actually need to do a full horizontal sum, since psadbw is actually doing
         * a partial reduction sum implicitly and only summing to integers in vector positions
         * 0 and 2. This saves us some contention on the shuffle port(s) */
        adler = partial_hsum(vs1) % BASE;
        sum2 = hsum(vs2) % BASE;
        max_iters = NMAX;
    }

    /* Process tail (len < 16).  */
    return adler32_len_16(adler, buf, len, sum2);
}